

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

void Js::JavascriptArray::InsertionSort<Memory::WriteBarrierPtr<void>>
               (WriteBarrierPtr<void> *list,uint32 length,CompareVarsInfo *cvInfo)

{
  _func_bool_CompareVarsInfo_ptr_void_ptr_void_ptr *p_Var1;
  void *pvVar2;
  ulong uVar3;
  WriteBarrierPtr<void> *pWVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  uint uVar11;
  WriteBarrierPtr<void> *local_40;
  void *local_38;
  WriteBarrierPtr<void> item;
  
  p_Var1 = cvInfo->compareType;
  local_38 = (void *)0x0;
  if (1 < length) {
    local_40 = list + 1;
    uVar10 = 1;
    do {
      pvVar2 = list[uVar10].ptr;
      Memory::Recycler::WBSetBit((char *)&local_38);
      local_38 = pvVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_38);
      bVar5 = (*p_Var1)(cvInfo,&local_38,list + (uVar10 - 1));
      uVar8 = uVar10 & 0xffffffff;
      if (bVar5) {
        uVar8 = 0;
      }
      uVar9 = (int)uVar10 - (uint)bVar5;
      while (uVar11 = uVar9, uVar7 = (uint)uVar8, uVar3 = uVar10, pWVar4 = local_40,
            pvVar2 = local_38, uVar7 < uVar11) {
        uVar6 = uVar11 - uVar7 >> 1;
        uVar9 = uVar6 + uVar7;
        bVar5 = (*p_Var1)(cvInfo,&local_38,list + uVar9);
        if (!bVar5) {
          uVar8 = (ulong)(uVar7 + uVar6 + 1);
          uVar9 = uVar11;
        }
      }
      for (; local_38 = pvVar2, uVar8 < uVar3; uVar3 = uVar3 - 1) {
        pvVar2 = pWVar4[-1].ptr;
        Memory::Recycler::WBSetBit((char *)pWVar4);
        pWVar4->ptr = pvVar2;
        Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar4);
        pWVar4 = pWVar4 + -1;
        pvVar2 = local_38;
      }
      pWVar4 = list + uVar8;
      Memory::Recycler::WBSetBit((char *)pWVar4);
      pWVar4->ptr = pvVar2;
      Memory::RecyclerWriteBarrierManager::WriteBarrier(pWVar4);
      uVar10 = uVar10 + 1;
      local_40 = local_40 + 1;
    } while (uVar10 != length);
  }
  return;
}

Assistant:

void JavascriptArray::InsertionSort(T* list, uint32 length, JavascriptArray::CompareVarsInfo* cvInfo)
    {
        bool (*compareType)(JavascriptArray::CompareVarsInfo*, const void*, const void*) = cvInfo->compareType;
        uint32 sortedCount = 1, lowerBound = 0, insertPoint = 0, upperBound = 0;
        T item;
        while (sortedCount < length)
        {
            item = list[sortedCount];
            upperBound = sortedCount;
            insertPoint = sortedCount - 1; // this lets us check for already ordered first
            lowerBound = 0;
            for (;;)
            {
                if (compareType (cvInfo, &item, &list[insertPoint]) )
                {
                    upperBound = insertPoint;
                }
                else
                {
                    lowerBound = insertPoint + 1;
                }
                if (lowerBound >= upperBound)
                {
                    break;
                }
                insertPoint = lowerBound + ((upperBound - lowerBound) / 2);
            }
            insertPoint = sortedCount;
            while (insertPoint > lowerBound)
            {
                list[insertPoint] = list[insertPoint - 1];
                --insertPoint;
            }
            list[lowerBound] = item;
            ++sortedCount;
        }
    }